

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCommit.h
# Opt level: O0

string * __thiscall
NewCommit::FormatIndexFile
          (string *__return_storage_ptr__,NewCommit *this,string *fileString,string *commit)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string word;
  int i;
  string *commit_local;
  string *fileString_local;
  NewCommit *this_local;
  string *result;
  
  word.field_2._M_local_buf[0xf] = '\0';
  std::operator+(__return_storage_ptr__,"commit ",commit);
  for (word.field_2._8_4_ = 0; uVar2 = (ulong)(int)word.field_2._8_4_,
      lVar3 = std::__cxx11::string::length(), uVar2 < lVar3 - 4U;
      word.field_2._8_4_ = word.field_2._8_4_ + 1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)fileString);
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)fileString);
    std::operator+(&local_70,&local_90,&local_c0);
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)fileString);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"add");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)fileString);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatIndexFile(string fileString, string commit) {
        string result = "commit " + commit;
        for (int i = 0; i < fileString.length() - 4; i++) {
            string word = fileString.substr(i, 1) + fileString.substr(i + 1, 1) + fileString.substr(i + 2, 1);
            if (word == "add") {
                result += "\n";
            }
            result += fileString[i];
        }

        return result;
    }